

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

bool __thiscall
XPMP2::SoundSystemFMOD::LoadSoundFile
          (SoundSystemFMOD *this,string *_sndName,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  char *pcVar1;
  undefined8 uVar2;
  unique_ptr<XPMP2::SoundFMOD,_std::default_delete<XPMP2::SoundFMOD>_> *this_00;
  byte in_CL;
  float *in_RDI;
  runtime_error *e;
  SoundFilePtr p;
  _Base_ptr *pp_Var3;
  _Base_ptr *__u;
  unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *in_stack_ffffffffffffff50;
  float *in_stack_ffffffffffffff58;
  float *in_stack_ffffffffffffff60;
  bool *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
  *this_01;
  float *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
  local_48;
  byte local_1;
  
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right._7_1_ = in_CL & 1;
  __u = &local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  this_00 = (unique_ptr<XPMP2::SoundFMOD,_std::default_delete<XPMP2::SoundFMOD>_> *)
            ((long)&local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 4);
  pp_Var3 = &local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  make_unique<XPMP2::SoundFMOD,XPMP2::SoundSystemFMOD*,std::__cxx11::string_const&,bool&,float&,float&,float&,float&,float&>
            ((SoundSystemFMOD **)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  this_01 = &local_48;
  std::unique_ptr<XPMP2::SoundFile,std::default_delete<XPMP2::SoundFile>>::
  unique_ptr<XPMP2::SoundFMOD,std::default_delete<XPMP2::SoundFMOD>,void>
            (in_stack_ffffffffffffff50,
             (unique_ptr<XPMP2::SoundFMOD,_std::default_delete<XPMP2::SoundFMOD>_> *)__u);
  std::unique_ptr<XPMP2::SoundFMOD,_std::default_delete<XPMP2::SoundFMOD>_>::~unique_ptr(this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
  ::operator[](this_01,in_stack_ffffffffffffff78);
  std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>::operator=
            ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)this_00,
             (unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)pp_Var3);
  if (glob < 1) {
    pcVar1 = " ";
    if ((local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right._7_1_ & 1) != 0) {
      pcVar1 = " looping ";
    }
    uVar2 = std::__cxx11::string::c_str();
    this_00 = (unique_ptr<XPMP2::SoundFMOD,_std::default_delete<XPMP2::SoundFMOD>_> *)
              std::__cxx11::string::c_str();
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
           ,0xf1,"LoadSoundFile",logDEBUG,"Added%ssound \'%s\' from file \'%s\'",pcVar1,uVar2);
  }
  local_1 = 1;
  std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>::~unique_ptr
            ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)this_00);
  return (bool)(local_1 & 1);
}

Assistant:

bool SoundSystemFMOD::LoadSoundFile (const std::string& _sndName,
                                     const std::string& _filePath, bool _bLoop,
                                     float _coneDir, float _conePitch,
                                     float _coneInAngle,
                                     float _coneOutAngle, float _coneOutVol)
{
    try {
        // Create the sound file object, loading the file into memory
        SoundFilePtr p = std::make_unique<SoundFMOD>(this, _filePath, _bLoop,
                                                     _coneDir, _conePitch,
                                                     _coneInAngle,
                                                     _coneOutAngle, _coneOutVol);
        // Have the sound file object managed by our map of sounds
        mapSounds[_sndName] = std::move(p);
        LOG_MSG(logDEBUG, "Added%ssound '%s' from file '%s'",
                _bLoop ? " looping " : " ", _sndName.c_str(), _filePath.c_str());
        return true;
    }
    catch (const std::runtime_error& e) {
        LOG_MSG(logERR, "Could not load sound '%s' from file '%s': %s",
                _sndName.c_str(), _filePath.c_str(), e.what());
    }
    catch (...) {
        LOG_MSG(logERR, "Could not load sound '%s' from file '%s'",
                _sndName.c_str(), _filePath.c_str());
    }
    return false;
}